

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool gl4cts::EnhancedLayouts::Utils::checkSSB
               (Program *program,Variable *variable,stringstream *stream)

{
  Interface *pIVar1;
  pointer pDVar2;
  Program *this;
  bool bVar3;
  GLuint index;
  ostream *poVar4;
  TestError *this_00;
  long lVar5;
  long lVar6;
  ulong uVar7;
  GLint offset;
  uint local_b4;
  stringstream *local_b0;
  string *local_a8;
  string *local_a0;
  Program *local_98;
  string name_str;
  string local_70;
  string local_50;
  
  local_98 = program;
  bVar3 = Variable::IsBlock(variable);
  if (bVar3) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    local_a0 = &pIVar1->m_name;
    local_b0 = stream + 0x10;
    local_a8 = &(variable->m_descriptor).m_name;
    lVar5 = ((long)(pIVar1->m_members).
                   super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x70 + 1;
    uVar7 = CONCAT71((int7)((ulong)local_b0 >> 8),1);
    lVar6 = 0;
    while (lVar5 = lVar5 + -1, lVar5 != 0) {
      local_b4 = (uint)uVar7;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name_str,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_50);
      offset = 0;
      Variable::GetReference
                (&local_50,local_a0,
                 (Descriptor *)
                 ((long)&((pIVar1->m_members).
                          super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_expected_component + lVar6),
                 BASIC,0);
      this = local_98;
      pDVar2 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&pDVar2->m_type + lVar6) == 1) {
        Variable::GetReference
                  (&local_70,&local_50,
                   (Descriptor *)**(undefined8 **)((long)&pDVar2->field_9 + lVar6),BASIC,0);
        std::__cxx11::string::_M_assign((string *)&name_str);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&name_str);
      }
      index = Program::GetResourceIndex(this,&name_str,0x92e5);
      Program::GetResource(this,0x92e5,index,0x92fc,1,&offset);
      pDVar2 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (offset == *(int *)((long)&pDVar2->m_offset + lVar6)) {
        uVar7 = (ulong)local_b4;
      }
      else {
        poVar4 = std::operator<<((ostream *)local_b0,"Uniform: ");
        poVar4 = std::operator<<(poVar4,(string *)((long)&(pDVar2->m_name)._M_dataplus + lVar6));
        poVar4 = std::operator<<(poVar4," - invalid offset: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,offset);
        poVar4 = std::operator<<(poVar4," expected: ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar7 = 0;
      }
      lVar6 = lVar6 + 0x70;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&name_str);
    }
    return (bool)((byte)uVar7 & 1);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x4ca);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkSSB(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		for (size_t i = 0; i < size; ++i)
		{
			GLuint		index	= 0;
			std::string name_str = "";
			GLint		offset   = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				name_str = member_name;
			}
			else
			{
				name_str = name;
			}

			try
			{
				index = program.GetResourceIndex(name_str, GL_BUFFER_VARIABLE);

				program.GetResource(GL_BUFFER_VARIABLE, index, GL_OFFSET, 1, &offset);
			}
			catch (std::exception& exc)
			{
				stream << "Failed to query program for buffer variable: " << variable.m_descriptor.m_name
					   << ". Reason: " << exc.what() << "\n";

				return false;
			}

			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offset != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offset
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}